

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O2

ssize_t __thiscall
sc_core::wif_sc_signed_trace::write(wif_sc_signed_trace *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  sc_signed_bitref_r *this_00;
  sc_signed *psVar5;
  int iVar6;
  undefined4 in_register_00000034;
  char *pcVar7;
  allocator_type local_4a;
  allocator_type local_49;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  if ((write(_IO_FILE*)::buf == '\0') &&
     (iVar6 = __cxa_guard_acquire(&write(_IO_FILE*)::buf), iVar6 != 0)) {
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_48._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&write::buf,0x400,(value_type_conflict *)&local_48,&local_4a);
    __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::buf,&__dso_handle);
    __cxa_guard_release(&write(_IO_FILE*)::buf);
  }
  iVar6 = this->object->nbits;
  pcVar7 = write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) <= (ulong)(long)iVar6) {
    local_4a = (allocator_type)0x0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_48,
               ((long)iVar6 & 0xfffffffffffff000U) + 0x1000,(value_type_conflict *)&local_4a,
               &local_49);
    pcVar3 = local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar2 = local_48._M_impl.super__Vector_impl_data._M_finish;
    pcVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
         write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start =
         write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_48._M_impl.super__Vector_impl_data._M_finish =
         write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar1;
    write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
    write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar3;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
    iVar6 = this->object->nbits;
    pcVar7 = write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  while (0 < iVar6) {
    iVar6 = iVar6 + -1;
    this_00 = sc_dt::sc_signed::operator[](this->object,iVar6);
    bVar4 = sc_dt::sc_signed_bitref_r::to_bool(this_00);
    *pcVar7 = "01"[bVar4];
    pcVar7 = pcVar7 + 1;
  }
  *pcVar7 = '\0';
  fprintf((FILE *)CONCAT44(in_register_00000034,__fd),"assign %s \"%s\" ;\n",
          (this->super_wif_trace).wif_name._M_dataplus._M_p,
          write::buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start);
  psVar5 = sc_dt::sc_signed::operator=(&this->old_value,this->object);
  return (ssize_t)psVar5;
}

Assistant:

void wif_sc_signed_trace::write(FILE* f)
{
    static std::vector<char> buf(1024);
    typedef std::vector<char>::size_type size_t;

    if ( buf.size() <= static_cast<size_t>(object.length()) ) { // include trailing \0
        size_t sz = ( static_cast<size_t>(object.length()) + 4096 ) & (~static_cast<size_t>(4096-1));
        std::vector<char>( sz ).swap( buf ); // resize without copying values
    }
    char *buf_ptr = &buf[0];

    for(int bitindex = object.length() - 1; bitindex >= 0; --bitindex) {
        *buf_ptr++ = "01"[object[bitindex].to_bool()];
    }
    *buf_ptr = '\0';

    std::fprintf(f, "assign %s \"%s\" ;\n", wif_name.c_str(), &buf[0]);
    old_value = object;
}